

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O3

void blend_a64_mask_sy_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined4 uVar1;
  undefined4 uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar7 = _DAT_0050dab0;
  do {
    uVar1 = *(undefined4 *)mask;
    uVar2 = *(undefined4 *)(mask + mask_stride);
    auVar16[0] = pavgb((char)uVar2,(char)uVar1);
    cVar8 = pavgb((char)((uint)uVar2 >> 8),(char)((uint)uVar1 >> 8));
    cVar9 = pavgb((char)((uint)uVar2 >> 0x10),(char)((uint)uVar1 >> 0x10));
    cVar10 = pavgb((char)((uint)uVar2 >> 0x18),(char)((uint)uVar1 >> 0x18));
    cVar11 = pavgb(0,0);
    cVar12 = pavgb(0,0);
    cVar13 = pavgb(0,0);
    cVar14 = pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    pavgb(0,0);
    uVar1 = *(undefined4 *)src0;
    uVar2 = *(undefined4 *)src1;
    auVar15._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11((char)((uint)uVar2 >> 0x18),(char)((uint)uVar1 >> 0x18)),
                                 (char)((uint)uVar2 >> 0x10)),
                        CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >> 0x20);
    auVar15[3] = (char)((uint)uVar2 >> 8);
    auVar15[2] = (char)((uint)uVar1 >> 8);
    auVar15[0] = (undefined1)uVar1;
    auVar15[1] = (char)uVar2;
    auVar15._8_8_ = 0;
    auVar16._8_8_ =
         (undefined8)
         (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(-cVar14,cVar14),-cVar13),
                                                       cVar13),-cVar12),cVar12),-cVar11),
                   CONCAT11(cVar11,cVar14)) >> 8);
    auVar16[7] = '@' - cVar10;
    auVar16[6] = cVar10;
    auVar16[5] = '@' - cVar9;
    auVar16[4] = cVar9;
    auVar16[3] = '@' - cVar8;
    auVar16[2] = cVar8;
    auVar16[1] = '@' - auVar16[0];
    auVar16 = pmaddubsw(auVar15,auVar16);
    auVar16 = pmulhrsw(auVar16,auVar7);
    sVar3 = auVar16._0_2_;
    sVar4 = auVar16._2_2_;
    sVar5 = auVar16._4_2_;
    sVar6 = auVar16._6_2_;
    *(uint *)dst = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar16[6] - (0xff < sVar6),
                            CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar16[4] - (0xff < sVar5),
                                     CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar16[2] -
                                              (0xff < sVar4),
                                              (0 < sVar3) * (sVar3 < 0x100) * auVar16[0] -
                                              (0xff < sVar3))));
    dst = dst + dst_stride;
    src0 = src0 + src0_stride;
    src1 = src1 + src1_stride;
    mask = mask + mask_stride * 2;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_sy_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  (void)w;

  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));

  do {
    const __m128i v_ra_b = xx_loadl_32(mask);
    const __m128i v_rb_b = xx_loadl_32(mask + mask_stride);
    const __m128i v_m0_b = _mm_avg_epu8(v_ra_b, v_rb_b);
    const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

    const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

    xx_storel_32(dst, v_res_b);

    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}